

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  void *ptr_id;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  ImVector<ImDrawList_*> *pIVar19;
  float fVar20;
  float fVar21;
  ImVec2 IVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ImVec2 IVar25;
  
  SetNextItemOpen(true,2);
  ptr_id = (void *)(ulong)(viewport->super_ImGuiViewport).ID;
  if (viewport->Window == (ImGuiWindow *)0x0) {
    pcVar6 = "N/A";
  }
  else {
    pcVar6 = viewport->Window->Name;
  }
  bVar4 = TreeNode(ptr_id,"Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                   (ulong)*(uint *)&(viewport->super_ImGuiViewport).field_0x5c,ptr_id,
                   (ulong)(viewport->super_ImGuiViewport).ParentViewportId,pcVar6);
  if (bVar4) {
    uVar1 = (viewport->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
               ,(double)(viewport->super_ImGuiViewport).Pos.x,
               (double)(viewport->super_ImGuiViewport).Pos.y,
               (double)(viewport->super_ImGuiViewport).Size.x,
               (double)(viewport->super_ImGuiViewport).Size.y,(double)(viewport->WorkOffsetMin).x,
               (double)(viewport->WorkOffsetMin).y,(double)(viewport->WorkOffsetMax).x,
               (double)(viewport->WorkOffsetMax).y,(ulong)(uint)(int)viewport->PlatformMonitor);
    pIVar3 = GImGui;
    if (0 < *(int *)&(viewport->super_ImGuiViewport).field_0x5c) {
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      if (pIVar2->SkipItems == false) {
        (pIVar2->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
        (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
        (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
        (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      }
      bVar4 = SmallButton("Reset Pos");
      if (bVar4) {
        (viewport->super_ImGuiViewport).Pos.x = 200.0;
        (viewport->super_ImGuiViewport).Pos.y = 200.0;
        fVar20 = (viewport->WorkOffsetMin).x;
        IVar22.x = fVar20 + 200.0;
        fVar21 = (viewport->WorkOffsetMin).y;
        IVar22.y = fVar21 + 200.0;
        IVar25 = (viewport->super_ImGuiViewport).Size;
        fVar20 = (viewport->WorkOffsetMax).x + (IVar25.x - fVar20);
        fVar21 = (viewport->WorkOffsetMax).y + (IVar25.y - fVar21);
        IVar25.x = (float)(-(uint)(0.0 < fVar20) & (uint)fVar20);
        IVar25.y = (float)(-(uint)(0.0 < fVar21) & (uint)fVar21);
        (viewport->super_ImGuiViewport).WorkPos = IVar22;
        (viewport->super_ImGuiViewport).WorkSize = IVar25;
        if (viewport->Window != (ImGuiWindow *)0x0) {
          viewport->Window->Pos = (viewport->super_ImGuiViewport).Pos;
        }
      }
    }
    pcVar6 = " IsPlatformMonitor";
    if ((uVar1 & 2) == 0) {
      pcVar6 = "";
    }
    pcVar5 = " OwnedByApp";
    if ((uVar1 & 4) == 0) {
      pcVar5 = "";
    }
    pcVar11 = " NoDecoration";
    if ((uVar1 & 8) == 0) {
      pcVar11 = "";
    }
    pcVar12 = " NoTaskBarIcon";
    if ((uVar1 & 0x10) == 0) {
      pcVar12 = "";
    }
    auVar24._0_4_ = -(uint)((uVar1 & 0x100) == 0);
    auVar24._4_4_ = -(uint)((uVar1 & 0x80) == 0);
    auVar24._8_4_ = -(uint)((uVar1 & 0x40) == 0);
    auVar24._12_4_ = -(uint)((uVar1 & 0x20) == 0);
    auVar23._0_4_ = -(uint)((uVar1 & 0x1000) == 0);
    auVar23._4_4_ = -(uint)((uVar1 & 0x800) == 0);
    auVar23._8_4_ = -(uint)((uVar1 & 0x400) == 0);
    auVar23._12_4_ = -(uint)((uVar1 & 0x200) == 0);
    auVar24 = packssdw(auVar23,auVar24);
    auVar24 = packsswb(auVar24,auVar24);
    pcVar9 = " NoFocusOnAppearing";
    if ((auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar9 = "";
    }
    pcVar10 = " NoFocusOnClick";
    if ((auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar10 = "";
    }
    pcVar18 = " NoInputs";
    if ((auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar18 = "";
    }
    pcVar15 = " NoRendererClear";
    if ((auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar15 = "";
    }
    pcVar16 = " TopMost";
    if ((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar16 = "";
    }
    pcVar8 = " Minimized";
    if ((auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar8 = "";
    }
    pcVar14 = " NoAutoMerge";
    if ((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar14 = "";
    }
    pcVar13 = " CanHostOtherWindows";
    if ((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar13 = "";
    }
    lVar17 = 0;
    BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s",
               (ulong)(uint)(viewport->super_ImGuiViewport).Flags,pcVar6,pcVar5,pcVar11,pcVar12,
               pcVar9,pcVar10,pcVar18,pcVar15,pcVar16,pcVar8,pcVar14,pcVar13);
    bVar4 = true;
    do {
      bVar7 = bVar4;
      if (0 < (viewport->DrawDataBuilder).Layers[lVar17].Size) {
        pIVar19 = (viewport->DrawDataBuilder).Layers + lVar17;
        lVar17 = 0;
        do {
          DebugNodeDrawList((ImGuiWindow *)0x0,viewport,pIVar19->Data[lVar17],"DrawList");
          lVar17 = lVar17 + 1;
        } while (lVar17 < pIVar19->Size);
      }
      lVar17 = 1;
      bVar4 = false;
    } while (bVar7);
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
            viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
        if (viewport->Idx > 0) { SameLine(); if (SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200, 200); viewport->UpdateWorkRect(); if (viewport->Window) viewport->Window->Pos = viewport->Pos; } }
        BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s", viewport->Flags,
            //(flags & ImGuiViewportFlags_IsPlatformWindow) ? " IsPlatformWindow" : "", // Omitting because it is the standard
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp) ? " OwnedByApp" : "",
            (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
            (flags & ImGuiViewportFlags_NoTaskBarIcon) ? " NoTaskBarIcon" : "",
            (flags & ImGuiViewportFlags_NoFocusOnAppearing) ? " NoFocusOnAppearing" : "",
            (flags & ImGuiViewportFlags_NoFocusOnClick) ? " NoFocusOnClick" : "",
            (flags & ImGuiViewportFlags_NoInputs) ? " NoInputs" : "",
            (flags & ImGuiViewportFlags_NoRendererClear) ? " NoRendererClear" : "",
            (flags & ImGuiViewportFlags_TopMost) ? " TopMost" : "",
            (flags & ImGuiViewportFlags_Minimized) ? " Minimized" : "",
            (flags & ImGuiViewportFlags_NoAutoMerge) ? " NoAutoMerge" : "",
            (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}